

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser.cpp
# Opt level: O3

string * __thiscall amrex::Parser::expr_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  peVar1 = (this->m_data).super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((peVar1 == (element_type *)0x0) || (peVar1->m_parser == (amrex_parser *)0x0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (peVar1->m_expression)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (peVar1->m_expression)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Parser::expr () const
{
    if (m_data && m_data->m_parser) {
        return m_data->m_expression;
    } else {
        return std::string{};
    }
}